

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int IDASetLinearSolverB(void *ida_mem,int which,SUNLinearSolver LS,SUNMatrix A)

{
  undefined8 *__ptr;
  SUNMatrix in_RCX;
  SUNLinearSolver in_RDX;
  int in_ESI;
  IDAMem in_RDI;
  int retval;
  void *ida_memB;
  IDALsMemB idalsB_mem;
  IDABMem IDAB_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem local_40;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-1,0x711,"IDASetLinearSolverB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->ida_adjMallocDone == 0) {
    IDAProcessError(in_RDI,-0x65,0x71a,"IDASetLinearSolverB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,"Illegal attempt to call before calling IDAAdjInit.");
    local_4 = -0x65;
  }
  else if (in_ESI < in_RDI->ida_adj_mem->ia_nbckpbs) {
    for (local_40 = in_RDI->ida_adj_mem->IDAB_mem;
        (local_40 != (IDABMem)0x0 && (in_ESI != local_40->ida_index)); local_40 = local_40->ida_next
        ) {
    }
    __ptr = (undefined8 *)malloc(0x58);
    if (__ptr == (undefined8 *)0x0) {
      IDAProcessError(in_RDI,-4,0x735,"IDASetLinearSolverB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                      ,"A memory request failed.");
      local_4 = -4;
    }
    else {
      *__ptr = 0;
      __ptr[1] = 0;
      __ptr[2] = 0;
      __ptr[3] = 0;
      __ptr[4] = 0;
      __ptr[5] = 0;
      __ptr[6] = 0;
      __ptr[7] = 0;
      __ptr[8] = 0;
      __ptr[9] = 0;
      __ptr[10] = 0;
      if (local_40->ida_lfree != (_func_int_IDABMem *)0x0) {
        (*local_40->ida_lfree)(local_40);
      }
      local_40->ida_lmem = __ptr;
      local_40->ida_lfree = idaLsFreeB;
      local_4 = IDASetLinearSolver((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,in_RCX)
      ;
      if (local_4 != 0) {
        free(__ptr);
      }
    }
  }
  else {
    IDAProcessError(in_RDI,-3,0x723,"IDASetLinearSolverB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,"Illegal value for which.");
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int IDASetLinearSolverB(void* ida_mem, int which, SUNLinearSolver LS, SUNMatrix A)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  void* ida_memB;
  int retval;

  /* Check if ida_mem exists */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Was ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDALS_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_WHICH);
    return (IDALS_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    IDAB_mem = IDAB_mem->ida_next;
  }

  /* Get memory for IDALsMemRecB */
  idalsB_mem = NULL;
  idalsB_mem = (IDALsMemB)malloc(sizeof(struct IDALsMemRecB));
  if (idalsB_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* initialize Jacobian and preconditioner functions */
  idalsB_mem->jacB      = NULL;
  idalsB_mem->jacBS     = NULL;
  idalsB_mem->jtsetupB  = NULL;
  idalsB_mem->jtsetupBS = NULL;
  idalsB_mem->jtimesB   = NULL;
  idalsB_mem->jtimesBS  = NULL;
  idalsB_mem->psetB     = NULL;
  idalsB_mem->psetBS    = NULL;
  idalsB_mem->psolveB   = NULL;
  idalsB_mem->psolveBS  = NULL;
  idalsB_mem->P_dataB   = NULL;

  /* free any existing system solver attached to IDAB */
  if (IDAB_mem->ida_lfree) { IDAB_mem->ida_lfree(IDAB_mem); }

  /* Attach lmemB data and lfreeB function. */
  IDAB_mem->ida_lmem  = idalsB_mem;
  IDAB_mem->ida_lfree = idaLsFreeB;

  /* set the linear solver for this backward problem */
  ida_memB = (void*)IDAB_mem->IDA_mem;
  retval   = IDASetLinearSolver(ida_memB, LS, A);
  if (retval != IDALS_SUCCESS)
  {
    free(idalsB_mem);
    idalsB_mem = NULL;
  }

  return (retval);
}